

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O2

void flush_bits_e(huff_entropy_ptr entropy)

{
  emit_bits_e(entropy,0x7f,7);
  (entropy->saved).put_buffer = 0;
  (entropy->saved).put_bits = 0;
  return;
}

Assistant:

LOCAL(void)
flush_bits_e (huff_entropy_ptr entropy)
{
  emit_bits_e(entropy, 0x7F, 7); /* fill any partial byte with ones */
  entropy->saved.put_buffer = 0; /* and reset bit-buffer to empty */
  entropy->saved.put_bits = 0;
}